

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O3

void __thiscall TPZIntPrism3D::SetOrder(TPZIntPrism3D *this,TPZVec<int> *ord,int type)

{
  int *piVar1;
  int iVar2;
  int type_00;
  int *piVar3;
  TPZManVector<int,_2> prc1;
  TPZManVector<int,_2> prc2;
  TPZVec<int> local_80;
  int local_60 [2];
  TPZVec<int> local_58;
  int local_38;
  int local_34;
  
  piVar3 = ord->fStore;
  this->fOrdKsi = *piVar3;
  iVar2 = piVar3[2];
  if (piVar3[2] < piVar3[1]) {
    iVar2 = piVar3[1];
  }
  this->fOrdKti = iVar2;
  TPZVec<int>::TPZVec(&local_80,0);
  local_80._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181c8e8;
  local_80.fNElements = 1;
  local_80.fNAlloc = 0;
  local_80.fStore = local_60;
  TPZVec<int>::TPZVec(&local_58,0);
  local_58._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181c8e8;
  local_58.fNElements = 2;
  local_58.fNAlloc = 0;
  piVar3 = ord->fStore;
  local_58.fStore = &local_38;
  *local_80.fStore = *piVar3;
  local_38 = piVar3[1];
  local_34 = piVar3[2];
  TPZInt1d::SetOrder(&this->fIntRule1D,&local_80,type);
  TPZIntTriang::SetOrder(&this->fIntTriang,&local_58,type_00);
  piVar3 = local_80.fStore;
  *local_80.fStore = (this->fIntRule1D).fOrdKsi;
  piVar1 = local_58.fStore;
  iVar2 = (this->fIntTriang).fOrdKsi;
  *local_58.fStore = iVar2;
  piVar1[1] = iVar2;
  this->fOrdKsi = *piVar3;
  this->fOrdKti = *piVar1;
  if (piVar1 != &local_38) {
    local_58.fNAlloc = 0;
    local_58._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    operator_delete__(piVar1);
    piVar3 = local_80.fStore;
  }
  if (piVar3 != local_60) {
    local_80.fNAlloc = 0;
    local_80._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (piVar3 != (int *)0x0) {
      operator_delete__(piVar3);
    }
  }
  return;
}

Assistant:

void TPZIntPrism3D::SetOrder(TPZVec<int> &ord,int type) {	
	fOrdKsi = ord[0];   //ordem na reta : zeta
	fOrdKti = (ord[1] > ord[2]) ? ord[1] : ord[2];   //ordem no plano XY
	TPZManVector<int,2> prc1(1),prc2(2);
	prc1[0] = ord[0];
	prc2[0] = ord[1];
	prc2[1] = ord[2];
	fIntRule1D.SetOrder(prc1,type);
	fIntTriang.SetOrder(prc2);
    fIntRule1D.GetOrder(prc1);
    fIntTriang.GetOrder(prc2);
    fOrdKsi = prc1[0];
    fOrdKti = prc2[0];
}